

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O3

void __thiscall DSaveMenu::DoSave(DSaveMenu *this,FSaveGameNode *node)

{
  FILE *__stream;
  FString filename;
  FString local_40;
  FString local_38;
  
  if (&this->NewSaveNode == node) {
    local_40.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    while( true ) {
      G_BuildSaveName((char *)&local_38,0x73ff31);
      FString::operator=(&local_40,&local_38);
      FString::~FString(&local_38);
      __stream = fopen(local_40.Chars,"rb");
      if (__stream == (FILE *)0x0) break;
      fclose(__stream);
    }
    G_SaveGame(local_40.Chars,(this->super_DLoadSaveMenu).savegamestring);
    FString::~FString(&local_40);
  }
  else {
    G_SaveGame((node->Filename).Chars,(this->super_DLoadSaveMenu).savegamestring);
  }
  M_ClearMenus();
  V_SetBorderNeedRefresh();
  return;
}

Assistant:

void DSaveMenu::DoSave (FSaveGameNode *node)
{
	if (node != &NewSaveNode)
	{
		G_SaveGame (node->Filename.GetChars(), savegamestring);
	}
	else
	{
		// Find an unused filename and save as that
		FString filename;
		int i;
		FILE *test;

		for (i = 0;; ++i)
		{
			filename = G_BuildSaveName ("save", i);
			test = fopen (filename, "rb");
			if (test == NULL)
			{
				break;
			}
			fclose (test);
		}
		G_SaveGame (filename, savegamestring);
	}
	M_ClearMenus();
	V_SetBorderNeedRefresh();
}